

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O3

void __thiscall OpenMD::KirkwoodBuff::writeRdf(KirkwoodBuff *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label;
  long *plVar4;
  pointer pbVar5;
  ulong uVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Revision r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  ofstream ofs;
  Revision local_36a;
  allocator_type local_369;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  string local_350;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  long *local_250 [2];
  long local_240 [2];
  long local_230;
  filebuf local_228 [8];
  undefined8 auStack_220 [29];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,
             (this->super_MultiComponentRDF).super_StaticAnalyser.outputFilename_._M_dataplus._M_p,
             _S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"KirkwoodBuff: unable to open %s\n",
             (this->super_MultiComponentRDF).super_StaticAnalyser.outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_MultiComponentRDF).super_StaticAnalyser.analysisType_.
                        _M_dataplus._M_p,
                        (this->super_MultiComponentRDF).super_StaticAnalyser.analysisType_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_350,&local_36a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_350._M_dataplus._M_p,local_350._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    paVar1 = &local_350.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != paVar1) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_350,&local_36a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_350._M_dataplus._M_p,local_350._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != paVar1) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# selection script1: \"",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               (this->super_MultiComponentRDF).selectionScript1_._M_dataplus._M_p,
               (this->super_MultiComponentRDF).selectionScript1_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\"\tselection script2: \"",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_MultiComponentRDF).selectionScript2_._M_dataplus._M_p,
                        (this->super_MultiComponentRDF).selectionScript2_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
    if ((this->super_MultiComponentRDF).super_StaticAnalyser.paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_MultiComponentRDF).super_StaticAnalyser.paramString_.
                          _M_dataplus._M_p,
                          (this->super_MultiComponentRDF).super_StaticAnalyser.paramString_.
                          _M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    local_350._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"g11","");
    local_330[0] = local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"g12","");
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"g22","");
    local_2f0[0] = local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"gC11","");
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"gC12","");
    local_2b0[0] = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"gC22","");
    local_290[0] = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"G11","");
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"G12","");
    plVar4 = local_240;
    local_250[0] = plVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"G22","");
    __l._M_len = 9;
    __l._M_array = &local_350;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_368,__l,&local_369);
    lVar7 = -0x120;
    do {
      if (plVar4 != (long *)plVar4[-2]) {
        operator_delete((long *)plVar4[-2],*plVar4 + 1);
      }
      plVar4 = plVar4 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# r",3);
    if (local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar5 = local_368.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
        *(undefined8 *)((long)auStack_220 + *(long *)(local_230 + -0x18)) = 0xf;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != local_368.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_350._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_350,1);
    if ((this->super_MultiComponentRDF).super_StaticAnalyser.nBins_ != 0) {
      uVar6 = 0;
      do {
        std::ostream::_M_insert<double>((double)(uVar6 & 0xffffffff) * this->deltaR_);
        lVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          *(undefined8 *)((long)auStack_220 + *(long *)(local_230 + -0x18)) = 0xf;
          std::ostream::_M_insert<double>
                    (*(double *)
                      (*(long *)((long)&(((this->gofrs_).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar7) + uVar6 * 8));
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x48);
        lVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          *(undefined8 *)((long)auStack_220 + *(long *)(local_230 + -0x18)) = 0xf;
          std::ostream::_M_insert<double>
                    (*(double *)
                      (*(long *)((long)&(((this->gCorr_).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar7) + uVar6 * 8));
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x48);
        lVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          *(undefined8 *)((long)auStack_220 + *(long *)(local_230 + -0x18)) = 0xf;
          std::ostream::_M_insert<double>
                    (*(double *)
                      (*(long *)((long)&(((this->G_).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar7) + uVar6 * 8));
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (this->super_MultiComponentRDF).super_StaticAnalyser.nBins_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_368);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void KirkwoodBuff::writeRdf() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision r;
      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      std::vector<std::string> labels {"g11",  "g12", "g22", "gC11", "gC12",
                                       "gC22", "G11", "G12", "G22"};

      ofs << "# r";

      for (const auto& label : labels)
        ofs << "\t" << std::setw(15) << label;

      ofs << '\n';

      for (unsigned int j = 0; j < nBins_; ++j) {
        RealType r = deltaR_ * j;
        ofs << r;
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << gofrs_[i][j];
        }
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << gCorr_[i][j];
        }
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << G_[i][j];
        }
        ofs << "\n";
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "KirkwoodBuff: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs.close();
  }